

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O3

void __thiscall qclab::qgates::CX<std::complex<double>_>::CX(CX<std::complex<double>_> *this)

{
  PauliX<std::complex<double>_> *pPVar1;
  
  (this->super_QControlledGate2<std::complex<double>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<double>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139c80;
  pPVar1 = (PauliX<std::complex<double>_> *)operator_new(0x10);
  (pPVar1->super_QGate1<std::complex<double>_>).qubit_ = 1;
  (pPVar1->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00139740;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>._M_head_impl =
       pPVar1;
  return;
}

Assistant:

CX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliX< T > >( 1 ) )
        { }